

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyFirePdu.cpp
# Opt level: O2

void __thiscall
DIS::DirectedEnergyFirePdu::marshal(DirectedEnergyFirePdu *this,DataStream *dataStream)

{
  pointer pSVar1;
  ulong uVar2;
  long lVar3;
  StandardVariableSpecification x;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityType::marshal(&this->_munitionType,dataStream);
  ClockTime::marshal(&this->_shotStartTime,dataStream);
  DataStream::operator<<(dataStream,this->_commulativeShotTime);
  Vector3Float::marshal(&this->_ApertureEmitterLocation,dataStream);
  DataStream::operator<<(dataStream,this->_apertureDiameter);
  DataStream::operator<<(dataStream,this->_wavelength);
  DataStream::operator<<(dataStream,this->_peakIrradiance);
  DataStream::operator<<(dataStream,this->_pulseRepetitionFrequency);
  DataStream::operator<<(dataStream,this->_pulseWidth);
  DataStream::operator<<(dataStream,this->_flags);
  DataStream::operator<<(dataStream,this->_pulseShape);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<(dataStream,this->_padding3);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             (((long)(this->_dERecords).
                     super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_dERecords).
                    super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28));
  lVar3 = 0;
  for (uVar2 = 0;
      pSVar1 = (this->_dERecords).
               super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->_dERecords).
                             super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28);
      uVar2 = uVar2 + 1) {
    StandardVariableSpecification::StandardVariableSpecification
              (&x,(StandardVariableSpecification *)
                  ((long)&pSVar1->_vptr_StandardVariableSpecification + lVar3));
    StandardVariableSpecification::marshal(&x,dataStream);
    StandardVariableSpecification::~StandardVariableSpecification(&x);
    lVar3 = lVar3 + 0x28;
  }
  return;
}

Assistant:

void DirectedEnergyFirePdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _munitionType.marshal(dataStream);
    _shotStartTime.marshal(dataStream);
    dataStream << _commulativeShotTime;
    _ApertureEmitterLocation.marshal(dataStream);
    dataStream << _apertureDiameter;
    dataStream << _wavelength;
    dataStream << _peakIrradiance;
    dataStream << _pulseRepetitionFrequency;
    dataStream << _pulseWidth;
    dataStream << _flags;
    dataStream << _pulseShape;
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << _padding3;
    dataStream << ( unsigned short )_dERecords.size();

     for(size_t idx = 0; idx < _dERecords.size(); idx++)
     {
        StandardVariableSpecification x = _dERecords[idx];
        x.marshal(dataStream);
     }

}